

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGA.hpp
# Opt level: O1

void __thiscall
PCCompatible::CGA::CRTCOutputter::perform_bus_cycle_phase1(CRTCOutputter *this,BusState *state)

{
  bool bVar1;
  ScanTarget *pSVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint8_t *puVar6;
  int iVar7;
  OutputState OVar8;
  undefined4 extraout_var;
  
  bVar1 = state->hsync;
  if (this->previous_hsync == bVar1) {
    this->cycles_since_hsync = this->cycles_since_hsync + this->clock_divider;
  }
  else {
    this->cycles_since_hsync = 0;
    this->previous_hsync = bVar1;
  }
  OVar8 = Sync;
  if (((bVar1 == false) && (OVar8 = Sync, state->vsync == false)) &&
     ((state->display_enable != true || (OVar8 = Pixels, (this->control_ & 8) == 0)))) {
    OVar8 = (this->cycles_since_hsync < 7 && (this->control_ & 4) == 0) | Border;
  }
  if ((((OVar8 != this->output_state) || (this->active_pixels_per_tick != this->pixels_per_tick)) ||
      (this->active_clock_divider != this->clock_divider)) ||
     ((this->active_border_colour != this->border_colour || (0x390 < this->count)))) {
    iVar3 = this->count;
    if (iVar3 != 0) {
      switch(this->output_state) {
      case Sync:
        Outputs::CRT::CRT::output_sync(&this->crt,iVar3 * this->active_clock_divider);
        break;
      case Pixels:
        iVar4 = iVar3 * this->active_pixels_per_tick;
        iVar7 = iVar4 + 7;
        if (-1 < iVar4) {
          iVar7 = iVar4;
        }
        Outputs::CRT::CRT::output_data
                  (&this->crt,this->active_clock_divider * iVar3,(long)(iVar7 >> 3));
        this->pixels = (uint8_t *)0x0;
        this->pixel_pointer = (uint8_t *)0x0;
        break;
      case Border:
        iVar3 = iVar3 * this->active_clock_divider;
        if (this->active_border_colour == '\0') {
          Outputs::CRT::CRT::output_level<unsigned_char>(&this->crt,iVar3,'\0');
        }
        else {
          Outputs::CRT::CRT::output_blank(&this->crt,iVar3);
        }
        break;
      case ColourBurst:
        Outputs::CRT::CRT::output_colour_burst
                  (&this->crt,iVar3 * this->active_clock_divider,200,false,')');
      }
    }
    this->output_state = OVar8;
    uVar5._0_4_ = this->clock_divider;
    uVar5._4_4_ = this->pixels_per_tick;
    uVar5 = uVar5 << 0x20 | uVar5 >> 0x20;
    this->active_pixels_per_tick = (int)uVar5;
    this->active_clock_divider = (int)(uVar5 >> 0x20);
    this->active_border_colour = this->border_colour;
    this->count = 0;
  }
  if (this->output_state == Pixels) {
    if (this->pixels == (uint8_t *)0x0) {
      pSVar2 = (this->crt).scan_target_;
      iVar3 = (*pSVar2->_vptr_ScanTarget[5])(pSVar2,0x140,1);
      puVar6 = (uint8_t *)CONCAT44(extraout_var,iVar3);
      (this->crt).allocated_data_length_ = -(ulong)(puVar6 == (uint8_t *)0x0) | 0x140;
      this->pixels = puVar6;
      this->pixel_pointer = puVar6;
      if ((puVar6 != (uint8_t *)0x0) && (this->count != 0)) {
        Outputs::CRT::CRT::output_blank(&this->crt,this->count * this->active_clock_divider);
        this->count = 0;
      }
    }
    if (this->pixels != (uint8_t *)0x0) {
      if (state->cursor == true) {
        if ((long)this->pixels_per_tick != 0) {
          memset(this->pixel_pointer,0x3f,(long)this->pixels_per_tick);
        }
      }
      else if (this->mode_ == Text) {
        serialise_text(this,state);
      }
      else {
        serialise_pixels(this,state);
      }
      this->pixel_pointer = this->pixel_pointer + this->active_pixels_per_tick;
    }
  }
  iVar3 = this->count + 8;
  this->count = iVar3;
  if ((this->output_state == Pixels) && (this->pixel_pointer == this->pixels + 0x140)) {
    iVar4 = iVar3 * this->active_pixels_per_tick;
    iVar7 = iVar4 + 7;
    if (-1 < iVar4) {
      iVar7 = iVar4;
    }
    Outputs::CRT::CRT::output_data(&this->crt,this->active_clock_divider * iVar3,(long)(iVar7 >> 3))
    ;
    this->pixels = (uint8_t *)0x0;
    this->pixel_pointer = (uint8_t *)0x0;
    this->count = 0;
  }
  return;
}

Assistant:

void perform_bus_cycle_phase1(const Motorola::CRTC::BusState &state) {
				// Determine new output state.
				update_hsync(state.hsync);
				const OutputState new_state = implied_state(state);
				static constexpr uint8_t colour_phase = 200;

				// Upon either a state change or just having accumulated too much local time...
				if(
					new_state != output_state ||
					active_pixels_per_tick != pixels_per_tick ||
					active_clock_divider != clock_divider ||
					active_border_colour != border_colour ||
					count > 912
				) {
					// (1) flush preexisting state.
					if(count) {
						switch(output_state) {
							case OutputState::Sync:			crt.output_sync(count * active_clock_divider);							break;
							case OutputState::Border:
								if(active_border_colour) {
									crt.output_blank(count * active_clock_divider);
								} else {
									crt.output_level<uint8_t>(count * active_clock_divider, active_border_colour);
								}
							break;
							case OutputState::ColourBurst:	crt.output_colour_burst(count * active_clock_divider, colour_phase);	break;
							case OutputState::Pixels:		flush_pixels();															break;
						}
					}

					// (2) adopt new state.
					output_state = new_state;
					active_pixels_per_tick = pixels_per_tick;
					active_clock_divider = clock_divider;
					active_border_colour = border_colour;
					count = 0;
				}

				// Collect pixels if applicable.
				if(output_state == OutputState::Pixels) {
					if(!pixels) {
						pixel_pointer = pixels = crt.begin_data(DefaultAllocationSize);

						// Flush any period where pixels weren't recorded due to back pressure.
						if(pixels && count) {
							crt.output_blank(count * active_clock_divider);
							count = 0;
						}
					}

					if(pixels) {
						if(state.cursor) {
							std::fill(pixel_pointer, pixel_pointer + pixels_per_tick, 0x3f); // i.e. white.
						} else {
							if(mode_ == Mode::Text) {
								serialise_text(state);
							} else {
								serialise_pixels(state);
							}
						}
						pixel_pointer += active_pixels_per_tick;
					}
				}

				// Advance.
				count += 8;

				// Output pixel row prematurely if storage is exhausted.
				if(output_state == OutputState::Pixels && pixel_pointer == pixels + DefaultAllocationSize) {
					flush_pixels();
					count = 0;
				}
			}